

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmGetPropertyCommand::HandleDirectoryMode(cmGetPropertyCommand *this)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmGlobalGenerator *this_00;
  cmLocalGenerator *pcVar3;
  char *value;
  PolicyID id;
  cmMakefile *this_01;
  allocator local_61;
  string dir;
  string local_40;
  
  this_01 = (this->super_cmCommand).Makefile;
  if ((this->Name)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&dir,(string *)&this->Name);
    bVar1 = cmsys::SystemTools::FileIsFullPath(dir._M_dataplus._M_p);
    if (!bVar1) {
      cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::assign((char *)&dir);
      std::__cxx11::string::append((char *)&dir);
      std::__cxx11::string::append((string *)&dir);
    }
    cmsys::SystemTools::CollapseFullPath(&local_40,&dir);
    std::__cxx11::string::operator=((string *)&dir,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    pcVar3 = cmGlobalGenerator::FindLocalGenerator(this_00,&dir);
    if (pcVar3 == (cmLocalGenerator *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_40,
                 "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                 ,&local_61);
      cmCommand::SetError(&this->super_cmCommand,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      this_01 = pcVar3->Makefile;
    }
    std::__cxx11::string::~string((string *)&dir);
    if (pcVar3 == (cmLocalGenerator *)0x0) {
      return false;
    }
  }
  bVar1 = std::operator==(&this->PropertyName,"DEFINITIONS");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(this_01,CMP0059);
    if (PVar2 != OLD) {
      if (PVar2 != WARN) goto LAB_003c0040;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&dir,(cmPolicies *)0x3b,id);
      cmMakefile::IssueMessage(this_01,AUTHOR_WARNING,&dir);
      std::__cxx11::string::~string((string *)&dir);
    }
    value = cmMakefile::GetDefineFlagsCMP0059(this_01);
  }
  else {
LAB_003c0040:
    value = cmMakefile::GetProperty(this_01,&this->PropertyName);
  }
  StoreResult(this,value);
  return true;
}

Assistant:

bool cmGetPropertyCommand::HandleDirectoryMode()
{
  // Default to the current directory.
  cmMakefile* mf = this->Makefile;

  // Lookup the directory if given.
  if(!this->Name.empty())
    {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = this->Name;
    if(!cmSystemTools::FileIsFullPath(dir.c_str()))
      {
      dir = this->Makefile->GetCurrentSourceDirectory();
      dir += "/";
      dir += this->Name;
      }

    // The local generators are associated with collapsed paths.
    dir = cmSystemTools::CollapseFullPath(dir);

    // Lookup the generator.
    if(cmLocalGenerator* lg =
       (this->Makefile->GetGlobalGenerator()->FindLocalGenerator(dir)))
      {
      // Use the makefile for the directory found.
      mf = lg->GetMakefile();
      }
    else
      {
      // Could not find the directory.
      this->SetError
        ("DIRECTORY scope provided but requested directory was not found. "
         "This could be because the directory argument was invalid or, "
         "it is valid but has not been processed yet.");
      return false;
      }
    }

  if (this->PropertyName == "DEFINITIONS")
    {
    switch(mf->GetPolicyStatus(cmPolicies::CMP0059))
      {
      case cmPolicies::WARN:
        mf->IssueMessage(cmake::AUTHOR_WARNING,
                         cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
      case cmPolicies::OLD:
        return this->StoreResult(mf->GetDefineFlagsCMP0059());
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        break;
      }
    }

  // Get the property.
  return this->StoreResult(mf->GetProperty(this->PropertyName));
}